

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonDocument.cpp
# Opt level: O1

JsonObject * __thiscall json::JsonDocument::setObjectAsRoot(JsonDocument *this)

{
  _Head_base<0UL,_json::JsonNode_*,_false> _Var1;
  _Head_base<0UL,_json::JsonNode_*,_false> this_00;
  JsonObject *pJVar2;
  
  this_00._M_head_impl = (JsonNode *)operator_new(0x50);
  JsonObject::JsonObject((JsonObject *)this_00._M_head_impl);
  _Var1._M_head_impl =
       (this->root)._M_t.super___uniq_ptr_impl<json::JsonNode,_std::default_delete<json::JsonNode>_>
       ._M_t.super__Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>.
       super__Head_base<0UL,_json::JsonNode_*,_false>._M_head_impl;
  (this->root)._M_t.super___uniq_ptr_impl<json::JsonNode,_std::default_delete<json::JsonNode>_>._M_t
  .super__Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>.
  super__Head_base<0UL,_json::JsonNode_*,_false>._M_head_impl = this_00._M_head_impl;
  if (_Var1._M_head_impl != (JsonNode *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_JsonNode + 8))();
  }
  pJVar2 = JsonNode::operator_cast_to_JsonObject_
                     ((this->root)._M_t.
                      super___uniq_ptr_impl<json::JsonNode,_std::default_delete<json::JsonNode>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>
                      .super__Head_base<0UL,_json::JsonNode_*,_false>._M_head_impl);
  return pJVar2;
}

Assistant:

JsonObject &JsonDocument::setObjectAsRoot()
    {
        root = std::unique_ptr<JsonObject>(new JsonObject());
        return *root;
    }